

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool __thiscall cmFindPackageCommand::FindModule(cmFindPackageCommand *this,bool *found)

{
  bool bVar1;
  string var;
  string mfile;
  string module;
  
  std::__cxx11::string::string((string *)&module,"Find",(allocator *)&mfile);
  std::__cxx11::string::append((string *)&module);
  std::__cxx11::string::append((char *)&module);
  cmMakefile::GetModulesFile_abi_cxx11_
            (&mfile,(this->super_cmFindCommon).super_cmCommand.Makefile,module._M_dataplus._M_p);
  if (mfile._M_string_length == 0) {
    bVar1 = true;
  }
  else {
    *found = true;
    std::__cxx11::string::string((string *)&var,(string *)&this->Name);
    std::__cxx11::string::append((char *)&var);
    cmMakefile::AddDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&var,"1");
    bVar1 = ReadListFile(this,mfile._M_dataplus._M_p,DoPolicyScope);
    cmMakefile::RemoveDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&var);
    std::__cxx11::string::~string((string *)&var);
  }
  std::__cxx11::string::~string((string *)&mfile);
  std::__cxx11::string::~string((string *)&module);
  return bVar1;
}

Assistant:

bool cmFindPackageCommand::FindModule(bool& found)
{
  std::string module = "Find";
  module += this->Name;
  module += ".cmake";
  std::string mfile = this->Makefile->GetModulesFile(module.c_str());
  if (!mfile.empty())
    {
    // Load the module we found, and set "<name>_FIND_MODULE" to true
    // while inside it.
    found = true;
    std::string var = this->Name;
    var += "_FIND_MODULE";
    this->Makefile->AddDefinition(var, "1");
    bool result = this->ReadListFile(mfile.c_str(), DoPolicyScope);
    this->Makefile->RemoveDefinition(var);
    return result;
    }
  return true;
}